

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O0

void __thiscall
QAccessiblePlainTextEdit::setText(QAccessiblePlainTextEdit *this,Text t,QString *text)

{
  bool bVar1;
  uint in_ESI;
  QPlainTextEdit *in_RDI;
  QString *in_stack_ffffffffffffffd8;
  
  if (in_ESI == 2) {
    plainTextEdit((QAccessiblePlainTextEdit *)0x7e34e6);
    bVar1 = QPlainTextEdit::isReadOnly(in_RDI);
    if (!bVar1) {
      plainTextEdit((QAccessiblePlainTextEdit *)0x7e3500);
      QPlainTextEdit::setPlainText(in_RDI,in_stack_ffffffffffffffd8);
    }
  }
  else {
    QAccessibleObject::setText((Text)in_RDI,(QString *)(ulong)in_ESI);
  }
  return;
}

Assistant:

void QAccessiblePlainTextEdit::setText(QAccessible::Text t, const QString &text)
{
    if (t != QAccessible::Value) {
        QAccessibleWidget::setText(t, text);
        return;
    }
    if (plainTextEdit()->isReadOnly())
        return;

    plainTextEdit()->setPlainText(text);
}